

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetShortPathNameW(LPCWSTR lpszLongPath,LPWSTR lpszShortPath,DWORD cchBuffer)

{
  uint uVar1;
  DWORD DVar2;
  size_t sVar3;
  undefined4 local_28;
  DWORD dwPathLen;
  DWORD cchBuffer_local;
  LPWSTR lpszShortPath_local;
  LPCWSTR lpszLongPath_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpszLongPath == (LPCWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpszLongPath_local._4_4_ = 0;
  }
  else {
    DVar2 = GetFileAttributesW(lpszLongPath);
    if (DVar2 == 0xffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      lpszLongPath_local._4_4_ = 0;
    }
    else {
      sVar3 = PAL_wcslen(lpszLongPath);
      uVar1 = (uint)sVar3;
      local_28 = uVar1 + 1;
      if (lpszShortPath != (LPWSTR)0x0) {
        if (cchBuffer < local_28) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(0x7a);
        }
        else {
          local_28 = uVar1;
          if (lpszLongPath != lpszShortPath) {
            PAL_wcsncpy(lpszShortPath,lpszLongPath,(ulong)cchBuffer);
          }
        }
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      lpszLongPath_local._4_4_ = local_28;
    }
  }
  return lpszLongPath_local._4_4_;
}

Assistant:

DWORD
PALAPI
GetShortPathNameW(
		 IN LPCWSTR lpszLongPath,
         OUT LPWSTR lpszShortPath,
  		 IN DWORD cchBuffer)
{
    DWORD dwPathLen = 0;

    PERF_ENTRY(GetShortPathNameW);
    ENTRY("GetShortPathNameW(lpszLongPath=%p (%S), lpszShortPath=%p (%S), "
          "cchBuffer=%d\n", lpszLongPath, lpszLongPath, lpszShortPath, lpszShortPath, cchBuffer);

    if ( !lpszLongPath )
    {
        ERROR( "lpszLongPath was not a valid pointer.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        LOGEXIT("GetShortPathNameW returns DWORD 0\n");
        PERF_EXIT(GetShortPathNameW);
        return 0;
    }
    else if (INVALID_FILE_ATTRIBUTES == GetFileAttributesW( lpszLongPath ))
    {
        // last error has been set by GetFileAttributes
        ERROR( "lpszLongPath does not exist.\n" );
        LOGEXIT("GetShortPathNameW returns DWORD 0\n");
        PERF_EXIT(GetShortPathNameW);
        return 0;
    }

    /* all lengths are # of TCHAR characters */
    /* "required size" includes space for the terminating null character */
    dwPathLen = PAL_wcslen(lpszLongPath)+1;

    /* lpszShortPath == 0 means caller is asking only for size */
    if ( lpszShortPath )
    {
        if ( dwPathLen > cchBuffer )
        {
            ERROR("Buffer is too small, need %d characters\n", dwPathLen);
            SetLastError( ERROR_INSUFFICIENT_BUFFER );
        } else
        {
            if ( lpszLongPath != lpszShortPath )
            {
                // Note: MSDN doesn't specify the behavior of GetShortPathName API
                //       if the buffers are overlap.
                PAL_wcsncpy( lpszShortPath, lpszLongPath, cchBuffer );
            }

            /* actual size not including terminating null is returned */
            dwPathLen--;
        }
    }

    LOGEXIT("GetShortPathNameW returns DWORD %u\n", dwPathLen);
    PERF_EXIT(GetShortPathNameW);
    return dwPathLen;
}